

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&>::endExpression
          (ExpressionLhs<const_std::shared_ptr<spdlog::logger>_&> *this)

{
  element_type *peVar1;
  ResultBuilder *pRVar2;
  bool in_DL;
  string local_38;
  
  pRVar2 = this->m_rb;
  peVar1 = (this->m_lhs->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)(peVar1 != (element_type *)0x0),in_DL);
  pRVar2 = ResultBuilder::setLhs(pRVar2,&local_38);
  pRVar2 = ResultBuilder::setResultType(pRVar2,peVar1 != (element_type *)0x0);
  ResultBuilder::endExpression(pRVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }